

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O3

char * dit::getCompilerName(int compiler)

{
  if ((uint)compiler < 4) {
    return &DAT_0021e978 + *(int *)(&DAT_0021e978 + (ulong)(uint)compiler * 4);
  }
  return (char *)0x0;
}

Assistant:

static const char* getCompilerName (int compiler)
{
	switch (compiler)
	{
		case DE_COMPILER_VANILLA:	return "DE_COMPILER_VANILLA";
		case DE_COMPILER_MSC:		return "DE_COMPILER_MSC";
		case DE_COMPILER_GCC:		return "DE_COMPILER_GCC";
		case DE_COMPILER_CLANG:		return "DE_COMPILER_CLANG";
		default:
			return DE_NULL;
	}
}